

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu_Impl.cpp
# Opt level: O0

void __thiscall
Vgm_Emu_Impl::update_fm_rates(Vgm_Emu_Impl *this,long *ym2413_rate,long *ym2612_rate)

{
  blargg_ulong bVar1;
  int iVar2;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  byte_ *p;
  byte *local_20;
  
  local_20 = (byte *)(*(long *)(in_RDI + 0x548) + 0x40);
  while (local_20 < *(byte **)(in_RDI + 0x558)) {
    switch(*local_20) {
    case 0x50:
    case 100:
      local_20 = local_20 + 2;
      break;
    case 0x51:
      *in_RDX = 0;
      return;
    case 0x52:
    case 0x53:
      *in_RDX = *in_RSI;
      *in_RSI = 0;
      return;
    case 0x54:
      *in_RSI = 0;
      *in_RDX = 0;
      return;
    default:
      iVar2 = command_len((uint)*local_20);
      local_20 = local_20 + iVar2;
      break;
    case 0x61:
      local_20 = local_20 + 3;
      break;
    case 0x66:
      return;
    case 0x67:
      bVar1 = get_le32(local_20 + 3);
      local_20 = local_20 + (bVar1 + 7);
    }
  }
  return;
}

Assistant:

void Vgm_Emu_Impl::update_fm_rates( long* ym2413_rate, long* ym2612_rate ) const
{
	byte const* p = data + 0x40;
	while ( p < data_end )
	{
		switch ( *p )
		{
		case cmd_end:
			return;
		
		case cmd_psg:
		case cmd_byte_delay:
			p += 2;
			break;
		
		case cmd_delay:
			p += 3;
			break;
		
		case cmd_data_block:
			p += 7 + get_le32( p + 3 );
			break;
		
		case cmd_ym2413:
			*ym2612_rate = 0;
			return;
		
		case cmd_ym2612_port0:
		case cmd_ym2612_port1:
			*ym2612_rate = *ym2413_rate;
			*ym2413_rate = 0;
			return;
		
		case cmd_ym2151:
			*ym2413_rate = 0;
			*ym2612_rate = 0;
			return;
		
		default:
			p += command_len( *p );
		}
	}
}